

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O0

void ftgcvsll_(int *A1,int *A2,LONGLONG *A3,LONGLONG *A4,int *A5,char *A6,char *A7,int *A8,int *A9,
              size_t C6,size_t C7)

{
  uint nelem_00;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char **ppcVar4;
  uint elem_len;
  uint local_d8;
  uint local_cc;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char **array;
  char *nulval;
  unsigned_long gMinStrLen;
  long repeat;
  long nelem;
  LONGLONG firstelem;
  LONGLONG firstrow;
  int type;
  int velem;
  int *status;
  int *anynul;
  fitsfile *pfStack_58;
  int colnum;
  fitsfile *fptr;
  uint B7M;
  uint B7N;
  char **B7;
  char *B6;
  char *A6_local;
  int *A5_local;
  LONGLONG *A4_local;
  LONGLONG *A3_local;
  int *A2_local;
  int *A1_local;
  
  B7 = (char **)0x0;
  nulval = (char *)0x50;
  pfStack_58 = gFitsFiles[*A1];
  anynul._4_4_ = *A2;
  firstelem = *A3;
  nelem = *A4;
  repeat = (long)*A5;
  B6 = A6;
  A6_local = (char *)A5;
  A5_local = (int *)A4;
  A4_local = A3;
  A3_local = (LONGLONG *)A2;
  A2_local = A1;
  if ((((C6 < 4) || (*A6 != '\0')) || (A6[1] != '\0')) || ((A6[2] != '\0' || (A6[3] != '\0')))) {
    pvVar2 = memchr(A6,0,C6);
    if (pvVar2 == (void *)0x0) {
      if (nulval < C6) {
        local_c8 = (char *)C6;
      }
      else {
        local_c8 = nulval;
      }
      B7 = (char **)malloc((size_t)(local_c8 + 1));
      *(undefined1 *)((long)B7 + C6) = 0;
      memcpy(B7,B6,C6);
      local_c0 = kill_trailing((char *)B7,' ');
    }
    else {
      local_c0 = B6;
    }
    local_b8 = local_c0;
  }
  else {
    local_b8 = (char *)0x0;
  }
  *A8 = *A8;
  status = A8;
  _type = A9;
  ffgtcl(pfStack_58,anynul._4_4_,(int *)&firstrow,(long *)&gMinStrLen,(long *)&nulval,A9);
  if ((int)firstrow < 0) {
    firstrow._4_4_ = 1;
  }
  else {
    firstrow._4_4_ = (int)repeat;
  }
  elem_len = (uint)C7;
  iVar1 = num_elem(A7,elem_len,firstrow._4_4_,-1);
  if (iVar1 < 2) {
    local_cc = 1;
  }
  else {
    local_cc = num_elem(A7,elem_len,firstrow._4_4_,-1);
  }
  fptr._4_4_ = local_cc;
  local_d8 = elem_len;
  if (C7 <= nulval) {
    local_d8 = (uint)nulval;
  }
  fptr._0_4_ = local_d8 + 1;
  _B7M = (char **)malloc((ulong)local_cc << 3);
  pcVar3 = (char *)malloc((ulong)(fptr._4_4_ * (int)fptr));
  ppcVar4 = _B7M;
  nelem_00 = fptr._4_4_;
  iVar1 = (int)fptr;
  *_B7M = pcVar3;
  pcVar3 = f2cstrv2(A7,*_B7M,elem_len,(int)fptr,fptr._4_4_);
  ppcVar4 = vindex(ppcVar4,iVar1,nelem_00,pcVar3);
  ffgcvs(pfStack_58,anynul._4_4_,firstelem,nelem,repeat,local_b8,ppcVar4,status,_type);
  if (B7 != (char **)0x0) {
    free(B7);
  }
  c2fstrv2(*_B7M,A7,(int)fptr,elem_len,fptr._4_4_);
  free(*_B7M);
  free(_B7M);
  *A8 = (uint)(*A8 != 0);
  return;
}

Assistant:

CFextern VOID_cfF(FTGCVSLL,ftgcvsll)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,LONGLONG,LONGLONG,LONG,STRING,PSTRINGV,PLOGICAL,PINT,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(LONGLONG,3)
   QCF(LONGLONG,4)
   QCF(LONG,5)
   QCF(STRING,6)
   QCF(PSTRINGV,7)
   QCF(PLOGICAL,8)
   QCF(PINT,9)

   fitsfile *fptr;
   int colnum, *anynul, *status, velem, type;
   LONGLONG firstrow, firstelem;
   long nelem;
   long repeat;
   unsigned long gMinStrLen=80L;  /* gMin = width */
   char *nulval, **array;

   fptr =      TCF(ftgcvsll,FITSUNIT,1,0);
   colnum =    TCF(ftgcvsll,INT,2,0);
   firstrow =  TCF(ftgcvsll,LONGLONG,3,0);
   firstelem = TCF(ftgcvsll,LONGLONG,4,0);
   nelem =     TCF(ftgcvsll,LONG,5,0);
   nulval =    TCF(ftgcvsll,STRING,6,0);
   /*  put off variable 7 (array) until column type is learned  */
   anynul =    TCF(ftgcvsll,PLOGICAL,8,0);
   status =    TCF(ftgcvsll,PINT,9,0);
   
   ffgtcl( fptr, colnum, &type, &repeat, (long *)&gMinStrLen, status );
   if( type<0 ) velem = 1;   /*  Variable length column  */
   else velem = nelem;

   array = TCF(ftgcvsll,PSTRINGV,7,0);

   ffgcvs( fptr, colnum, firstrow, firstelem, nelem, nulval, array,
           anynul, status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(LONGLONG,3)
   RCF(LONGLONG,4)
   RCF(LONG,5)
   RCF(STRING,6)
   RCF(PSTRINGV,7)
   RCF(PLOGICAL,8)
   RCF(PINT,9)
}